

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

size_t convert<unsigned_long>(char *buf,unsigned_long value)

{
  undefined1 auVar1 [16];
  char *__last;
  char *pcStack_28;
  int lsd;
  char *p;
  unsigned_long i;
  unsigned_long value_local;
  char *buf_local;
  
  pcStack_28 = buf;
  p = (char *)value;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = p;
    p = (char *)((ulong)p / 10);
    __last = pcStack_28 + 1;
    *pcStack_28 = zero[SUB164(auVar1 % ZEXT816(10),0)];
    pcStack_28 = __last;
  } while (p != (char *)0x0);
  *__last = '\0';
  std::reverse<char*>(buf,__last);
  return (long)__last - (long)buf;
}

Assistant:

size_t convert(char buf[], T value) {
    T i = value;
    char* p = buf;

    do {
        int lsd = static_cast<int>(i % 10);
        i /= 10;
        *p++ = zero[lsd];
    } while (i != 0);

    if (value < 0) {
        *p++ = '-';
    }
    *p = '\0';
    std::reverse(buf, p);

    return p - buf;
}